

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManBuiltInSimPerformInt(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  word *pwVar3;
  word *pwVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  
  pGVar2 = Gia_ManObj(p,iObj);
  pwVar3 = Gia_ManBuiltInData(p,iObj);
  pwVar4 = Gia_ManBuiltInData(p,iObj - (*(uint *)pGVar2 & 0x1fffffff));
  pwVar5 = Gia_ManBuiltInData(p,iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff));
  if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
    __assert_fail("p->fBuiltInSim || p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x323,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
  }
  uVar7 = *(ulong *)pGVar2;
  uVar1 = p->nSimWords;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  if (((uint)uVar7 >> 0x1d & 1) == 0) {
    if ((uVar7 >> 0x3d & 1) == 0) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        pwVar3[uVar7] = pwVar5[uVar7] & pwVar4[uVar7];
      }
    }
    else {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        pwVar3[uVar7] = ~pwVar5[uVar7] & pwVar4[uVar7];
      }
    }
  }
  else if ((uVar7 >> 0x3d & 1) == 0) {
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pwVar3[uVar7] = ~pwVar4[uVar7] & pwVar5[uVar7];
    }
  }
  else {
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pwVar3[uVar7] = ~(pwVar5[uVar7] | pwVar4[uVar7]);
    }
  }
  if (p->vSims->nSize == uVar1 * p->nObjs) {
    return;
  }
  __assert_fail("Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x336,"void Gia_ManBuiltInSimPerformInt(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManBuiltInSimPerformInt( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj ); int w;
    word * pInfo  = Gia_ManBuiltInData( p, iObj ); 
    word * pInfo0 = Gia_ManBuiltInData( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pInfo1 = Gia_ManBuiltInData( p, Gia_ObjFaninId1(pObj, iObj) ); 
    assert( p->fBuiltInSim || p->fIncrSim );
    if ( Gia_ObjFaninC0(pObj) )
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = ~pInfo0[w] & pInfo1[w];
    }
    else 
    {
        if (  Gia_ObjFaninC1(pObj) )
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & ~pInfo1[w];
        else 
            for ( w = 0; w < p->nSimWords; w++ )
                pInfo[w] = pInfo0[w] & pInfo1[w];
    }
    assert( Vec_WrdSize(p->vSims) == Gia_ManObjNum(p) * p->nSimWords );
}